

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O3

xmlChar * xmlEscapeFormatString(xmlChar **msg)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  xmlChar *pxVar6;
  xmlChar xVar7;
  xmlChar *pxVar8;
  ulong uVar9;
  
  if ((msg != (xmlChar **)0x0) && (pxVar6 = *msg, pxVar6 != (xmlChar *)0x0)) {
    if (*pxVar6 == '\0') {
      return pxVar6;
    }
    uVar5 = 0;
    uVar3 = 1;
    xVar1 = *pxVar6;
    do {
      xVar7 = xVar1;
      uVar9 = uVar3;
      uVar4 = uVar5;
      uVar5 = (xVar7 == '%') + uVar4;
      uVar3 = uVar9 + 1;
      xVar1 = pxVar6[uVar9];
    } while (pxVar6[uVar9] != '\0');
    if (uVar5 == 0) {
      return pxVar6;
    }
    if (uVar9 <= 0x7fffffff - uVar5 && uVar5 < 0x80000000) {
      pxVar6 = (xmlChar *)(*xmlMallocAtomic)((xVar7 == '%') + uVar4 + uVar9 + 1);
      if (pxVar6 != (xmlChar *)0x0) {
        xVar1 = **msg;
        pxVar2 = *msg;
        pxVar8 = pxVar6;
        while (xVar1 != '\0') {
          *pxVar8 = xVar1;
          if (*pxVar2 == '%') {
            pxVar8[1] = '%';
            pxVar8 = pxVar8 + 1;
          }
          pxVar8 = pxVar8 + 1;
          xVar1 = pxVar2[1];
          pxVar2 = pxVar2 + 1;
        }
        pxVar6[uVar9 + (xVar7 == '%') + uVar4] = '\0';
        (*xmlFree)(*msg);
        *msg = pxVar6;
        return pxVar6;
      }
      (*xmlFree)(*msg);
      *msg = (xmlChar *)0x0;
      xmlErrMemory((xmlParserCtxtPtr)0x0,(char *)0x0);
      return (xmlChar *)0x0;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlEscapeFormatString(xmlChar **msg)
{
    xmlChar *msgPtr = NULL;
    xmlChar *result = NULL;
    xmlChar *resultPtr = NULL;
    size_t count = 0;
    size_t msgLen = 0;
    size_t resultLen = 0;

    if (!msg || !*msg)
        return(NULL);

    for (msgPtr = *msg; *msgPtr != '\0'; ++msgPtr) {
        ++msgLen;
        if (*msgPtr == '%')
            ++count;
    }

    if (count == 0)
        return(*msg);

    if ((count > INT_MAX) || (msgLen > INT_MAX - count))
        return(NULL);
    resultLen = msgLen + count + 1;
    result = (xmlChar *) xmlMallocAtomic(resultLen);
    if (result == NULL) {
        /* Clear *msg to prevent format string vulnerabilities in
           out-of-memory situations. */
        xmlFree(*msg);
        *msg = NULL;
        xmlErrMemory(NULL, NULL);
        return(NULL);
    }

    for (msgPtr = *msg, resultPtr = result; *msgPtr != '\0'; ++msgPtr, ++resultPtr) {
        *resultPtr = *msgPtr;
        if (*msgPtr == '%')
            *(++resultPtr) = '%';
    }
    result[resultLen - 1] = '\0';

    xmlFree(*msg);
    *msg = result;

    return *msg;
}